

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_constant spvc_compiler_get_constant_handle(spvc_compiler compiler,spvc_variable_id id)

{
  pointer this;
  SPIRConstant *pSVar1;
  exception *e;
  ConstantID local_20;
  uint32_t local_1c;
  spvc_compiler psStack_18;
  spvc_variable_id id_local;
  spvc_compiler compiler_local;
  
  local_1c = id;
  psStack_18 = compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)3>::TypedID(&local_20,local_1c);
  pSVar1 = spirv_cross::Compiler::get_constant(this,local_20);
  return (spvc_constant)pSVar1;
}

Assistant:

spvc_constant spvc_compiler_get_constant_handle(spvc_compiler compiler, spvc_variable_id id)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		return static_cast<spvc_constant>(&compiler->compiler->get_constant(id));
	}